

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsNumberNotInRange_Test::
~ValidationErrorTest_ExtensionDeclarationsNumberNotInRange_Test
          (ValidationErrorTest_ExtensionDeclarationsNumberNotInRange_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsNumberNotInRange) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 9999
            options: {
              declaration: { number: 9999 full_name: ".abc" type: ".Bar" }
            }
          }
        }
      )pb",
      "foo.proto: Foo: NUMBER: Extension declaration number 9999 is not in the "
      "extension range.\n");
}